

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

size_t fileSize(file_t file)

{
  int iVar1;
  long __off;
  ulong uVar2;
  size_t sVar3;
  
  __off = ftell((FILE *)file);
  sVar3 = 0xffffffffffffffff;
  if (__off != -1) {
    iVar1 = fseek((FILE *)file,0,2);
    if (iVar1 == 0) {
      uVar2 = ftell((FILE *)file);
      if (uVar2 != 0xffffffffffffffff) {
        iVar1 = fseek((FILE *)file,__off,0);
        sVar3 = -(ulong)(iVar1 != 0) | uVar2;
      }
    }
  }
  return sVar3;
}

Assistant:

size_t fileSize(file_t file)
{
	size_t pos;
	size_t size;
	ASSERT(fileIsValid(file));
	if ((pos = fileTell(file)) == SIZE_MAX ||
		!fileSeek(file, 0, SEEK_END) ||
		(size = fileTell(file)) == SIZE_MAX ||
		!fileSeek(file, pos, SEEK_SET))
		return SIZE_MAX;
	return size;
}